

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O3

Uint16 X11_KeyToUnicode(SDL12Key key,SDL12Mod mod)

{
  if ((int)key < 0x7f) {
    if (key - SDLK12_a < 0x1a) {
      return ((short)key +
             (ushort)(((mod >> 0xd & 1) == 0) !=
                     ((mod & (KMOD12_RSHIFT|KMOD12_LSHIFT)) != KMOD12_NONE)) * 0x20) - 0x20;
    }
  }
  else {
    key = SDLK12_FIRST;
  }
  return (Uint16)key;
}

Assistant:

SDLCALL
X11_KeyToUnicode(SDL12Key key, SDL12Mod mod)
{
    if (((int) key) >= 127) {
        return 0;
    }
    if ((key >= SDLK12_a) && (key <= SDLK12_z)) {
        const int shifted = ((mod & (KMOD12_LSHIFT|KMOD12_RSHIFT)) != 0) ? 1 : 0;
        int capital = ((mod & KMOD12_CAPS) != 0) ? 1 : 0;
        if (shifted) {
            capital = !capital;
        }
        return (Uint16) ((capital ? 'A' : 'a') + (key - SDLK12_a));
    }

    return (Uint16) key;
}